

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O1

double orient2dexact(double *pa,double *pb,double *pc)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double cterms [4];
  double bterms [4];
  double aterms [4];
  double w [12];
  double v [8];
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0 [13];
  double local_58 [9];
  
  dVar8 = *pa;
  dVar2 = pb[1];
  dVar6 = dVar8 * dVar2;
  dVar11 = dVar8 * splitter - (dVar8 * splitter - dVar8);
  dVar10 = dVar8 - dVar11;
  dVar3 = dVar2 * splitter - (dVar2 * splitter - dVar2);
  dVar4 = dVar2 - dVar3;
  dVar12 = dVar10 * dVar4 - (((dVar6 - dVar11 * dVar3) - dVar10 * dVar3) - dVar11 * dVar4);
  dVar5 = pc[1];
  dVar8 = dVar8 * dVar5;
  dVar9 = splitter * dVar5 - (splitter * dVar5 - dVar5);
  dVar7 = dVar5 - dVar9;
  dVar10 = dVar10 * dVar7 - (((dVar8 - dVar11 * dVar9) - dVar10 * dVar9) - dVar11 * dVar7);
  dVar11 = dVar12 - dVar10;
  local_d8 = (dVar12 - (dVar11 + (dVar12 - dVar11))) + ((dVar12 - dVar11) - dVar10);
  dVar10 = dVar6 + dVar11;
  dVar6 = (dVar6 - (dVar10 - (dVar10 - dVar6))) + (dVar11 - (dVar10 - dVar6));
  dVar11 = dVar6 - dVar8;
  local_d0 = (dVar6 - (dVar11 + (dVar6 - dVar11))) + ((dVar6 - dVar11) - dVar8);
  local_c0[0] = dVar10 + dVar11;
  local_c8 = (dVar10 - (local_c0[0] - (local_c0[0] - dVar10))) + (dVar11 - (local_c0[0] - dVar10));
  dVar8 = *pb;
  dVar5 = dVar5 * dVar8;
  dVar12 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar11 = dVar8 - dVar12;
  dVar7 = dVar7 * dVar11 - (((dVar5 - dVar12 * dVar9) - dVar9 * dVar11) - dVar12 * dVar7);
  dVar6 = pa[1];
  dVar8 = dVar8 * dVar6;
  dVar10 = splitter * dVar6 - (splitter * dVar6 - dVar6);
  dVar9 = dVar6 - dVar10;
  dVar11 = dVar11 * dVar9 - (((dVar8 - dVar12 * dVar10) - dVar11 * dVar10) - dVar12 * dVar9);
  dVar12 = dVar7 - dVar11;
  local_f8 = (dVar7 - (dVar12 + (dVar7 - dVar12))) + ((dVar7 - dVar12) - dVar11);
  dVar7 = dVar5 + dVar12;
  dVar5 = (dVar5 - (dVar7 - (dVar7 - dVar5))) + (dVar12 - (dVar7 - dVar5));
  dVar11 = dVar5 - dVar8;
  local_f0 = (dVar5 - (dVar11 + (dVar5 - dVar11))) + ((dVar5 - dVar11) - dVar8);
  local_e0 = dVar7 + dVar11;
  local_e8 = (dVar7 - (local_e0 - (local_e0 - dVar7))) + (dVar11 - (local_e0 - dVar7));
  dVar8 = *pc;
  dVar6 = dVar6 * dVar8;
  dVar5 = splitter * dVar8 - (splitter * dVar8 - dVar8);
  dVar2 = dVar2 * dVar8;
  dVar8 = dVar8 - dVar5;
  dVar7 = dVar9 * dVar8 - (((dVar6 - dVar5 * dVar10) - dVar10 * dVar8) - dVar5 * dVar9);
  dVar8 = dVar8 * dVar4 - (((dVar2 - dVar5 * dVar3) - dVar3 * dVar8) - dVar5 * dVar4);
  dVar5 = dVar7 - dVar8;
  local_118 = (dVar7 - (dVar5 + (dVar7 - dVar5))) + ((dVar7 - dVar5) - dVar8);
  dVar8 = dVar6 + dVar5;
  dVar6 = (dVar6 - (dVar8 - (dVar8 - dVar6))) + (dVar5 - (dVar8 - dVar6));
  dVar5 = dVar6 - dVar2;
  local_110 = (dVar6 - (dVar5 + (dVar6 - dVar5))) + ((dVar6 - dVar5) - dVar2);
  local_100 = dVar8 + dVar5;
  local_108 = (dVar8 - (local_100 - (local_100 - dVar8))) + (dVar5 - (local_100 - dVar8));
  iVar1 = fast_expansion_sum_zeroelim(4,&local_d8,4,&local_f8,local_58);
  iVar1 = fast_expansion_sum_zeroelim(iVar1,local_58,4,&local_118,local_c0 + 1);
  return local_c0[iVar1];
}

Assistant:

REAL orient2dexact(REAL *pa, REAL *pb, REAL *pc)
{
  INEXACT REAL axby1, axcy1, bxcy1, bxay1, cxay1, cxby1;
  REAL axby0, axcy0, bxcy0, bxay0, cxay0, cxby0;
  REAL aterms[4], bterms[4], cterms[4];
  INEXACT REAL aterms3, bterms3, cterms3;
  REAL v[8], w[12];
  int vlength, wlength;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  Two_Product(pa[0], pb[1], axby1, axby0);
  Two_Product(pa[0], pc[1], axcy1, axcy0);
  Two_Two_Diff(axby1, axby0, axcy1, axcy0,
               aterms3, aterms[2], aterms[1], aterms[0]);
  aterms[3] = aterms3;

  Two_Product(pb[0], pc[1], bxcy1, bxcy0);
  Two_Product(pb[0], pa[1], bxay1, bxay0);
  Two_Two_Diff(bxcy1, bxcy0, bxay1, bxay0,
               bterms3, bterms[2], bterms[1], bterms[0]);
  bterms[3] = bterms3;

  Two_Product(pc[0], pa[1], cxay1, cxay0);
  Two_Product(pc[0], pb[1], cxby1, cxby0);
  Two_Two_Diff(cxay1, cxay0, cxby1, cxby0,
               cterms3, cterms[2], cterms[1], cterms[0]);
  cterms[3] = cterms3;

  vlength = fast_expansion_sum_zeroelim(4, aterms, 4, bterms, v);
  wlength = fast_expansion_sum_zeroelim(vlength, v, 4, cterms, w);

  return w[wlength - 1];
}